

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

int metacall_function_return_type(void *func,metacall_value_id *id)

{
  type_id tVar1;
  signature s_00;
  type t;
  type_id *in_RSI;
  function_conflict in_RDI;
  signature s;
  function f;
  undefined4 local_4;
  
  if (in_RDI == (function_conflict)0x0) {
    *in_RSI = 0x14;
  }
  else {
    s_00 = function_signature(in_RDI);
    t = signature_get_return(s_00);
    tVar1 = type_index(t);
    *in_RSI = tVar1;
  }
  local_4 = (uint)(in_RDI == (function_conflict)0x0);
  return local_4;
}

Assistant:

int metacall_function_return_type(void *func, enum metacall_value_id *id)
{
	if (func != NULL)
	{
		function f = (function)func;
		signature s = function_signature(f);

		*id = type_index(signature_get_return(s));

		return 0;
	}

	*id = METACALL_INVALID;

	return 1;
}